

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O3

void __thiscall
QGraphicsAnchorLayoutPrivate::identifyFloatItems
          (QGraphicsAnchorLayoutPrivate *this,QSet<QtGraphicsAnchorLayout::AnchorData_*> *visited,
          Orientation orientation)

{
  long lVar1;
  QGraphicsLayoutItem **ppQVar2;
  ulong uVar3;
  Node<QGraphicsLayoutItem_*,_QHashDummyValue> *pNVar4;
  QHash<QGraphicsLayoutItem_*,_QHashDummyValue> QVar5;
  ulong uVar6;
  Data *pDVar7;
  long lVar8;
  long in_FS_OFFSET;
  QGraphicsLayoutItem *item;
  Data *local_60;
  QHash<QGraphicsLayoutItem_*,_QHashDummyValue> local_58;
  QHash<QGraphicsLayoutItem_*,_QHashDummyValue> local_50;
  QHashDummyValue local_41;
  QHash<QGraphicsLayoutItem_*,_QHashDummyValue> local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_50.d = (Data *)0x0;
  pDVar7 = (visited->q_hash).d;
  if (pDVar7 == (Data *)0x0) {
    pDVar7 = (Data *)0x0;
    uVar6 = 0;
LAB_005c2c67:
    if (uVar6 == 0 && pDVar7 == (Data *)0x0) goto LAB_005c2cea;
  }
  else {
    if (pDVar7->spans->offsets[0] == 0xff) {
      uVar3 = 1;
      do {
        uVar6 = uVar3;
        if (pDVar7->numBuckets == uVar6) {
          pDVar7 = (Data *)0x0;
          uVar6 = 0;
          break;
        }
        uVar3 = uVar6 + 1;
      } while (pDVar7->spans[uVar6 >> 7].offsets[(uint)uVar6 & 0x7f] == 0xff);
      goto LAB_005c2c67;
    }
    uVar6 = 0;
  }
  do {
    identifyNonFloatItems_helper
              (this,*(AnchorData **)
                     pDVar7->spans[uVar6 >> 7].entries
                     [pDVar7->spans[uVar6 >> 7].offsets[(uint)uVar6 & 0x7f]].storage.data,
               (QSet<QGraphicsLayoutItem_*> *)&local_50);
    do {
      if (pDVar7->numBuckets - 1 == uVar6) {
        uVar6 = 0;
        pDVar7 = (Data *)0x0;
        break;
      }
      uVar6 = uVar6 + 1;
    } while (pDVar7->spans[uVar6 >> 7].offsets[(uint)uVar6 & 0x7f] == 0xff);
  } while (uVar6 != 0 || pDVar7 != (Data *)0x0);
LAB_005c2cea:
  local_58.d = (Data *)0x0;
  lVar1 = (this->items).d.size;
  if (lVar1 == 0) {
    QVar5.d = (Data *)0x0;
  }
  else {
    ppQVar2 = (this->items).d.ptr;
    lVar8 = 0;
    do {
      local_60 = *(Data **)((long)ppQVar2 + lVar8);
      if ((local_50.d == (Data *)0x0) ||
         (pNVar4 = QHashPrivate::Data<QHashPrivate::Node<QGraphicsLayoutItem*,QHashDummyValue>>::
                   findNode<QGraphicsLayoutItem*>
                             ((Data<QHashPrivate::Node<QGraphicsLayoutItem*,QHashDummyValue>> *)
                              local_50.d,(QGraphicsLayoutItem **)&local_60),
         pNVar4 == (Node<QGraphicsLayoutItem_*,_QHashDummyValue> *)0x0)) {
        local_40.d = local_60;
        QHash<QGraphicsLayoutItem*,QHashDummyValue>::emplace<QHashDummyValue_const&>
                  ((QHash<QGraphicsLayoutItem*,QHashDummyValue> *)&local_58,
                   (QGraphicsLayoutItem **)&local_40,&local_41);
      }
      lVar8 = lVar8 + 8;
      QVar5.d = local_58.d;
    } while (lVar1 << 3 != lVar8);
  }
  local_58.d = (Data *)0x0;
  local_40.d = *(Data **)(&this->graphHasConflicts + (long)(int)orientation * 4);
  *(Data **)(&this->graphHasConflicts + (long)(int)orientation * 4) = QVar5.d;
  QHash<QGraphicsLayoutItem_*,_QHashDummyValue>::~QHash(&local_40);
  QHash<QGraphicsLayoutItem_*,_QHashDummyValue>::~QHash(&local_58);
  QHash<QGraphicsLayoutItem_*,_QHashDummyValue>::~QHash(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsAnchorLayoutPrivate::identifyFloatItems(const QSet<AnchorData *> &visited, Qt::Orientation orientation)
{
    QSet<QGraphicsLayoutItem *> nonFloating;

    for (const AnchorData *ad : visited)
        identifyNonFloatItems_helper(ad, &nonFloating);

    QSet<QGraphicsLayoutItem *> floatItems;
    for (QGraphicsLayoutItem *item : std::as_const(items)) {
        if (!nonFloating.contains(item))
            floatItems.insert(item);
    }
    m_floatItems[orientation] = std::move(floatItems);
}